

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_flattening.cpp
# Opt level: O0

void __thiscall
ModelFlattening_importingAliasedUnits_Test::ModelFlattening_importingAliasedUnits_Test
          (ModelFlattening_importingAliasedUnits_Test *this)

{
  ModelFlattening_importingAliasedUnits_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__ModelFlattening_importingAliasedUnits_Test_001a3d78;
  return;
}

Assistant:

TEST(ModelFlattening, importingAliasedUnits)
{
    const std::string importModelString =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"change_model\">\n"
        "  <units name=\"alias_mm\">\n"
        "    <unit units=\"mm\"/>\n"
        "  </units>\n"
        "  <units name=\"alias_mim\">\n"
        "    <unit units=\"mim\"/>\n"
        "  </units>\n"
        "  <units name=\"mm\">\n"
        "    <unit prefix=\"milli\" units=\"second\"/>\n"
        "  </units>\n"
        "  <units name=\"mim\">\n"
        "    <unit prefix=\"micro\" units=\"second\"/>\n"
        "  </units>\n"
        "  <component name=\"change\">\n"
        "    <variable name=\"var1\" units=\"alias_mm\"/>\n"
        "    <variable name=\"var2\" units=\"alias_mim\"/>\n"
        "    <variable name=\"var3\" units=\"mm\"/>\n"
        "    <variable name=\"var4\" units=\"mim\"/>\n"
        "  </component>\n"
        "</model>";
    const std::string modelString =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"multiple_clash\">\n"
        "  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"change_model.cellml\">\n"
        "    <component component_ref=\"change\" name=\"change\"/>\n"
        "  </import>\n"
        "  <units name=\"mm\">\n"
        "    <unit prefix=\"milli\" units=\"metre\"/>\n"
        "  </units>\n"
        "  <units name=\"mim\">\n"
        "    <unit prefix=\"micro\" units=\"metre\"/>\n"
        "  </units>\n"
        "  <component name=\"opposite\">\n"
        "    <variable name=\"var1\" units=\"mm\"/>\n"
        "    <variable name=\"var2\" units=\"mim\"/>\n"
        "  </component>\n"
        "</model>";
    const std::string e =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"multiple_clash\">\n"
        "  <units name=\"mm\">\n"
        "    <unit prefix=\"milli\" units=\"metre\"/>\n"
        "  </units>\n"
        "  <units name=\"mim\">\n"
        "    <unit prefix=\"micro\" units=\"metre\"/>\n"
        "  </units>\n"
        "  <units name=\"mm_1\">\n"
        "    <unit prefix=\"milli\" units=\"second\"/>\n"
        "  </units>\n"
        "  <units name=\"mim_1\">\n"
        "    <unit prefix=\"micro\" units=\"second\"/>\n"
        "  </units>\n"
        "  <component name=\"change\">\n"
        "    <variable name=\"var1\" units=\"mm_1\"/>\n"
        "    <variable name=\"var2\" units=\"mim_1\"/>\n"
        "    <variable name=\"var3\" units=\"mm_1\"/>\n"
        "    <variable name=\"var4\" units=\"mim_1\"/>\n"
        "  </component>\n"
        "  <component name=\"opposite\">\n"
        "    <variable name=\"var1\" units=\"mm\"/>\n"
        "    <variable name=\"var2\" units=\"mim\"/>\n"
        "  </component>\n"
        "</model>\n";

    auto importer = libcellml::Importer::create();
    auto parser = libcellml::Parser::create();
    auto validator = libcellml::Validator::create();

    auto model = parser->parseModel(modelString);
    auto importModel = parser->parseModel(importModelString);

    EXPECT_TRUE(model->hasUnresolvedImports());

    importer->addModel(importModel, "change_model.cellml");

    importer->resolveImports(model, ".");
    auto flattenedModel = importer->flattenModel(model);
    EXPECT_EQ(size_t(4), flattenedModel->unitsCount());

    libcellml::PrinterPtr printer = libcellml::Printer::create();
    const std::string a = printer->printModel(flattenedModel);
    EXPECT_EQ(e, a);
}